

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fVerbose;
  uint fNew;
  uint uVar2;
  uint nFrames;
  int iVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  uint local_74;
  uint local_70;
  uint local_6c;
  char *local_58;
  char *local_50;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fNew = 0;
  Extra_UtilGetoptReset();
  local_6c = 1;
  local_70 = 0x1e;
  local_74 = 8;
  nFrames = 0x20;
  fVerbose = 0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
LAB_00238366:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"FWTALnmvh"), iVar3 = globalUtilOptind, iVar1 == 0x41)
    {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-A\" should be followed by a file name.\n";
LAB_002384f8:
        Abc_Print(-1,pcVar4);
        goto LAB_00238502;
      }
      local_50 = argv[globalUtilOptind];
LAB_00238451:
      globalUtilOptind = globalUtilOptind + 1;
    }
    if (iVar1 == 0x46) {
      if (globalUtilOptind < argc) {
        nFrames = atoi(argv[globalUtilOptind]);
        uVar2 = nFrames;
        goto joined_r0x00238431;
      }
      pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
      goto LAB_002384f8;
    }
    if (iVar1 == 0x4c) {
      if (globalUtilOptind < argc) {
        local_58 = argv[globalUtilOptind];
        goto LAB_00238451;
      }
      pcVar4 = "Command line switch \"-L\" should be followed by a file name.\n";
      goto LAB_002384f8;
    }
    if (iVar1 == 0x54) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_002384f8;
      }
      local_70 = atoi(argv[globalUtilOptind]);
      uVar2 = local_70;
    }
    else {
      if (iVar1 != 0x57) {
        if (iVar1 == 0x6d) {
          local_6c = local_6c ^ 1;
        }
        else if (iVar1 == 0x6e) {
          fNew = fNew ^ 1;
        }
        else {
          if (iVar1 != 0x76) {
            if (iVar1 == -1) {
              if (pNtk == (Abc_Ntk_t *)0x0) {
                pcVar4 = "Empty network.\n";
              }
              else if (pNtk->ntkType == ABC_NTK_STRASH) {
                if ((local_50 == (char *)0x0) || (pNtk->nObjCounts[8] == 0)) {
                  if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
                    free(pNtk->pSeqModel);
                    pNtk->pSeqModel = (Abc_Cex_t *)0x0;
                  }
                  iVar3 = Abc_NtkDarSeqSim(pNtk,nFrames,local_74,local_70,fNew,local_6c,fVerbose,
                                           local_50);
                  pAbc->Status = iVar3;
                  Abc_FrameReplaceCex(pAbc,&pNtk->pSeqModel);
                  if (local_58 == (char *)0x0) {
                    return 0;
                  }
                  Abc_NtkWriteLogFile(local_58,pAbc->pCex,pAbc->Status,pAbc->nFrames,"sim");
                  return 0;
                }
                pcVar4 = 
                "Currently simulation with user-specified patterns works only for comb miters.\n";
              }
              else {
                pcVar4 = "Only works for strashed networks.\n";
              }
              iVar3 = -1;
              goto LAB_00238621;
            }
            goto LAB_00238502;
          }
          fVerbose = fVerbose ^ 1;
        }
        goto LAB_00238366;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_002384f8;
      }
      local_74 = atoi(argv[globalUtilOptind]);
      uVar2 = local_74;
    }
joined_r0x00238431:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_00238502:
      iVar3 = -2;
      Abc_Print(-2,"usage: sim [-FWT num] [-AL file] [-nmvh]\n");
      Abc_Print(-2,"\t          performs random simulation of the sequential miter\n");
      Abc_Print(-2,"\t-F num  : the number of frames to simulate [default = %d]\n",(ulong)nFrames);
      Abc_Print(-2,"\t-W num  : the number of words to simulate [default = %d]\n",(ulong)local_74);
      Abc_Print(-2,"\t-T num  : approximate runtime limit in seconds [default = %d]\n",
                (ulong)local_70);
      Abc_Print(-2,
                "\t-A file : text file name with user\'s patterns [default = random simulation]\n");
      Abc_Print(-2,"\t          (patterns are listed, one per line, as sequences of 0s and 1s)\n");
      pcVar4 = "no logging";
      if (local_58 != (char *)0x0) {
        pcVar4 = local_58;
      }
      Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",pcVar4);
      pcVar4 = "Sort new";
      if (fNew == 0) {
        pcVar4 = "Sort old";
      }
      Abc_Print(-2,"\t-n      : toggle new vs. old implementation [default = %s]\n",pcVar4 + 5);
      pcVar4 = "miter";
      if (local_6c == 0) {
        pcVar4 = "circuit";
      }
      Abc_Print(-2,"\t-m      : toggle miter vs. any circuit [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar4 = "\t-h      : print the command usage\n";
LAB_00238621:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fNew;
    int fComb;
    int nFrames;
    int nWords;
    int TimeOut;
    int fMiter;
    int fVerbose;
    char * pFileSim;
    char * pLogFileName = NULL;
    extern int Abc_NtkDarSeqSim( Abc_Ntk_t * pNtk, int nFrames, int nWords, int TimeOut, int fNew, int fMiter, int fVerbose, char * pFileSim );
    // set defaults
    fNew       =  0;
    fComb      =  0;
    nFrames    = 32;
    nWords     =  8;
    TimeOut    = 30;
    fMiter     =  1;
    fVerbose   =  0;
    pFileSim   = NULL;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWTALnmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeOut < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileSim = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'n':
            fNew ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }
    if ( pFileSim != NULL && Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "Currently simulation with user-specified patterns works only for comb miters.\n" );
        return 1;
    }
    ABC_FREE( pNtk->pSeqModel );
    pAbc->Status = Abc_NtkDarSeqSim( pNtk, nFrames, nWords, TimeOut, fNew, fMiter, fVerbose, pFileSim );
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "sim" );
    return 0;

usage:
    Abc_Print( -2, "usage: sim [-FWT num] [-AL file] [-nmvh]\n" );
    Abc_Print( -2, "\t          performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t-F num  : the number of frames to simulate [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-W num  : the number of words to simulate [default = %d]\n", nWords );
    Abc_Print( -2, "\t-T num  : approximate runtime limit in seconds [default = %d]\n", TimeOut );
    Abc_Print( -2, "\t-A file : text file name with user's patterns [default = random simulation]\n" );
    Abc_Print( -2, "\t          (patterns are listed, one per line, as sequences of 0s and 1s)\n" );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n",  pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-n      : toggle new vs. old implementation [default = %s]\n", fNew? "new": "old" );
    Abc_Print( -2, "\t-m      : toggle miter vs. any circuit [default = %s]\n", fMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}